

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

size_t chunk_unwrite(buf_chunk *chunk,size_t len)

{
  size_t n;
  size_t len_local;
  buf_chunk *chunk_local;
  
  chunk_local = (buf_chunk *)(chunk->w_offset - chunk->r_offset);
  if (chunk_local == (buf_chunk *)0x0) {
    chunk_local = (buf_chunk *)0x0;
  }
  else if (len < chunk_local) {
    chunk->w_offset = chunk->w_offset - len;
    chunk_local = (buf_chunk *)len;
  }
  else {
    chunk->w_offset = 0;
    chunk->r_offset = 0;
  }
  return (size_t)chunk_local;
}

Assistant:

static size_t chunk_unwrite(struct buf_chunk *chunk, size_t len)
{
  size_t n = chunk->w_offset - chunk->r_offset;
  DEBUGASSERT(chunk->w_offset >= chunk->r_offset);
  if(!n) {
    return 0;
  }
  else if(n <= len) {
    chunk->r_offset = chunk->w_offset = 0;
    return n;
  }
  else {
    chunk->w_offset -= len;
    return len;
  }
}